

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialElement.cpp
# Opt level: O0

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::MaterialElement::childElementForName(MaterialElement *this,string *name)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  shared_ptr<iDynTree::XMLElement> sVar5;
  string message;
  shared_ptr<iDynTree::XMLElement> *element;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffef8;
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  *in_stack_ffffffffffffff00;
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  XMLParserState *in_stack_ffffffffffffff18;
  undefined1 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined1 local_c1 [33];
  string local_a0 [40];
  function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
  local_78;
  undefined1 local_50 [55];
  undefined1 local_19;
  
  local_19 = 0;
  this_01 = in_RDI;
  iDynTree::XMLElement::getParserState();
  std::make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b724c);
    puVar6 = local_50;
    std::
    function<bool(std::unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>const&)>
    ::
    function<iDynTree::MaterialElement::childElementForName(std::__cxx11::string_const&)::__0,void>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    iDynTree::XMLElement::setAttributeCallback(peVar2,puVar6);
    std::
    function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
    ::~function((function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                 *)0x1b7299);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::operator==(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    _Var4._M_pi = extraout_RDX_00;
    if (bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              __shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b730e);
      this_00 = &local_78;
      std::
      function<bool(std::unordered_map<std::__cxx11::string,std::shared_ptr<iDynTree::XMLAttribute>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<iDynTree::XMLAttribute>>>>const&)>
      ::
      function<iDynTree::MaterialElement::childElementForName(std::__cxx11::string_const&)::__1,void>
                (this_00,(anon_class_8_1_8991fb9c *)__lhs);
      iDynTree::XMLElement::setAttributeCallback(__lhs,this_00);
      std::
      function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
      ::~function((function<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&)>
                   *)0x1b735b);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_01,in_RSI,(allocator<char> *)in_RDI);
      std::
      __shared_ptr_access<iDynTree::MaterialElement::MaterialInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::MaterialElement::MaterialInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b7390);
      std::operator+(__lhs,__rhs);
      std::__cxx11::string::~string((string *)(local_c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_c1);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportWarning("MaterialElement","childElementForName::texture",pcVar3);
      std::__cxx11::string::~string(local_a0);
      _Var4._M_pi = extraout_RDX_01;
    }
  }
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar5.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<XMLElement> MaterialElement::childElementForName(const std::string& name)
    {
        std::shared_ptr<XMLElement> element = std::make_shared<XMLElement>(
            getParserState(), name);
        if (name == "color") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>>& attributes){
                auto found = attributes.find("rgba");
                if (found != attributes.end()) {
                    m_info->m_rgba = std::make_shared<iDynTree::Vector4>();
                    vector4FromString(found->second->value(), *m_info->m_rgba);
                }
                return true;
            });
        } else if (name == "texture") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>>& attributes){
                auto found = attributes.find("filename");
                if (found != attributes.end()) {
                    m_info->m_textureFilename = found->second->value();
                }
                return true;
            });
            std::string message = std::string("Texture tag not supported by iDynTree. Skipping material ") + m_info->m_name;
            reportWarning("MaterialElement", "childElementForName::texture", message.c_str());
        }
        return element;
    }